

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O2

void __thiscall
boost::filesystem::directory_iterator::directory_iterator(directory_iterator *this,path *p)

{
  dir_itr_imp *this_00;
  
  this_00 = (dir_itr_imp *)operator_new(0x40);
  detail::dir_itr_imp::dir_itr_imp(this_00);
  shared_ptr<boost::filesystem::detail::dir_itr_imp>::
  shared_ptr<boost::filesystem::detail::dir_itr_imp>(&this->m_imp,this_00);
  detail::directory_iterator_construct(this,p,(error_code *)0x0);
  return;
}

Assistant:

explicit directory_iterator(const path& p)
        : m_imp(new detail::dir_itr_imp)
          { detail::directory_iterator_construct(*this, p, 0); }